

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_points_3.h
# Opt level: O0

void draco::
     DequantizePoints3<__gnu_cxx::__normal_iterator<draco::VectorD<unsigned_int,3>*,std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::PointAttributeVectorOutputIterator<float>>
               (__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                *begin,__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                       *end,QuantizationInfo *info,PointAttributeVectorOutputIterator<float> *oit)

{
  bool bVar1;
  PointAttributeVectorOutputIterator<float> *in_RCX;
  PointAttributeVectorOutputIterator<float> *in_RDX;
  undefined8 *in_RDI;
  float z;
  float y;
  float x;
  __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
  it;
  Dequantizer dequantize;
  uint32_t max_quantized_value;
  float range;
  uint32_t quantization_bits;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  PointAttributeVectorOutputIterator<float> *in_stack_ffffffffffffffb0;
  float local_44;
  float local_40;
  float local_3c;
  __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
  local_38;
  Dequantizer local_30;
  int32_t local_2c;
  float local_28;
  undefined4 local_24;
  
  local_24 = *(undefined4 *)
              &(in_RDX->memory_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_28 = *(float *)((long)&(in_RDX->memory_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4);
  local_2c = (1 << ((byte)local_24 & 0x1f)) + -1;
  Dequantizer::Dequantizer(&local_30);
  Dequantizer::Init(&local_30,local_28,local_2c);
  local_38._M_current = (VectorD<unsigned_int,_3> *)*in_RDI;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
    ::operator*(&local_38);
    VectorD<unsigned_int,_3>::operator[]
              ((VectorD<unsigned_int,_3> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    local_3c = Dequantizer::operator()
                         ((Dequantizer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    __gnu_cxx::
    __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
    ::operator*(&local_38);
    VectorD<unsigned_int,_3>::operator[]
              ((VectorD<unsigned_int,_3> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    local_40 = Dequantizer::operator()
                         ((Dequantizer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    __gnu_cxx::
    __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
    ::operator*(&local_38);
    VectorD<unsigned_int,_3>::operator[]
              ((VectorD<unsigned_int,_3> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    local_44 = Dequantizer::operator()
                         ((Dequantizer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    VectorD<float,_3>::VectorD
              ((VectorD<float,_3> *)&stack0xffffffffffffffb0,&local_3c,&local_40,&local_44);
    PointAttributeVectorOutputIterator<float>::operator*(in_RCX);
    PointAttributeVectorOutputIterator<float>::operator=(in_RDX,(VectorD<float,_3> *)in_RCX);
    PointAttributeVectorOutputIterator<float>::operator++(in_stack_ffffffffffffffb0);
    __gnu_cxx::
    __normal_iterator<draco::VectorD<unsigned_int,_3>_*,_std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void DequantizePoints3(const QPointIterator &begin, const QPointIterator &end,
                       const QuantizationInfo &info, OutputIterator &oit) {
  DRACO_DCHECK_GE(info.quantization_bits, 0);
  DRACO_DCHECK_GE(info.range, 0);

  const uint32_t quantization_bits = info.quantization_bits;
  const float range = info.range;
  const uint32_t max_quantized_value((1u << quantization_bits) - 1);
  Dequantizer dequantize;
  dequantize.Init(range, max_quantized_value);

  for (auto it = begin; it != end; ++it) {
    const float x = dequantize((*it)[0] - max_quantized_value);
    const float y = dequantize((*it)[1] - max_quantized_value);
    const float z = dequantize((*it)[2] - max_quantized_value);
    *oit = Point3f(x, y, z);
    ++oit;
  }
}